

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<__11,int&>&,__11,int&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [46],
               DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
               *params_1,anon_enum_32 *params_2,int *params_3)

{
  ArrayPtr<kj::String> argValues_00;
  undefined4 in_register_00000014;
  DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
  *params_00;
  anon_enum_32 *params_01;
  int *params_02;
  long lVar1;
  undefined4 in_register_00000034;
  size_t sVar2;
  String *in_stack_ffffffffffffff58;
  String argValues [4];
  
  sVar2 = CONCAT44(in_register_00000034,line);
  str<char_const(&)[46]>
            (argValues,(kj *)CONCAT44(in_register_00000014,severity),
             (char (*) [46])CONCAT44(in_register_00000014,severity));
  str<kj::_::DebugComparison<__11,int&>&>(argValues + 1,(kj *)macroArgs,params_00);
  str<__11&>(argValues + 2,(kj *)params,params_01);
  str<int&>(argValues + 3,(kj *)params_1,params_02);
  argValues_00.size_ = sVar2;
  argValues_00.ptr = in_stack_ffffffffffffff58;
  logInternal((Debug *)
              "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              ,(char *)((ulong)file & 0xffffffff),2,(LogSeverity)sVar2,(char *)argValues,
              argValues_00);
  lVar1 = 0x48;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}